

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Cord * __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::elements
          (RepeatedField<absl::lts_20240722::Cord> *this,bool is_soo)

{
  int iVar1;
  uint uVar2;
  Cord *pCVar3;
  uint *__dest;
  void *pvVar4;
  Rep *__src;
  long lVar5;
  undefined8 uVar6;
  RepeatedPtrFieldBase *unaff_RBX;
  RepeatedPtrFieldBase *this_00;
  int iVar7;
  long unaff_RBP;
  undefined7 in_register_00000031;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  Arena *unaff_R14;
  undefined1 auVar11 [16];
  LogMessageFatal aLStack_58 [16];
  undefined1 local_10 [16];
  
  uVar8 = 0;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    uVar8 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < (int)uVar8) {
    if (is_soo) {
      return (Cord *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pCVar3 = (Cord *)internal::LongSooRep::elements((LongSooRep *)this);
    return pCVar3;
  }
  iVar9 = (int)local_10;
  this_00 = (RepeatedPtrFieldBase *)(ulong)uVar8;
  elements();
  if (iVar9 < 1) {
    internal::RepeatedPtrFieldBase::InternalExtend((RepeatedPtrFieldBase *)aLStack_58);
    this_00 = unaff_RBX;
  }
  else {
    iVar1 = this_00->capacity_proxy_;
    unaff_RBP = (long)iVar1 + 1;
    unaff_R14 = this_00->arena_;
    iVar7 = (int)unaff_RBP;
    uVar8 = iVar9 + iVar7;
    if (uVar8 == 0 || SCARRY4(iVar9,iVar7) != (int)uVar8 < 0) {
      uVar10 = 1;
      goto LAB_001740cf;
    }
    if (iVar1 < 0x3ffffffb) {
      if (iVar1 < -1) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                   ,0x488,0x28,"capacity == 0 || capacity >= lower_limit");
        uVar6 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                          (aLStack_58);
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (uVar6,1," ");
        _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                  (uVar6);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_58);
      }
      uVar2 = iVar7 * 2 + 1;
      if (uVar8 < uVar2) {
        uVar8 = uVar2;
      }
      uVar10 = (ulong)uVar8;
      goto LAB_001740cf;
    }
  }
  uVar10 = 0x7fffffff;
LAB_001740cf:
  iVar9 = (int)uVar10;
  if (unaff_R14 == (Arena *)0x0) {
    uVar10 = uVar10 * 8 + 8;
    lVar5 = __tls_get_addr(&PTR_001b3e58);
    if (*(code **)(lVar5 + 0x20) == (code *)0x0) {
      pvVar4 = operator_new(uVar10);
      auVar11._8_8_ = uVar10;
      auVar11._0_8_ = pvVar4;
    }
    else {
      auVar11 = (**(code **)(lVar5 + 0x20))(uVar10,*(undefined8 *)(lVar5 + 0x28));
    }
    __dest = auVar11._0_8_;
    iVar9 = (int)(auVar11._8_8_ + 0x7fffffff8U >> 3);
  }
  else {
    __dest = (uint *)Arena::AllocateForArray(unaff_R14,uVar10 * 8 + 0xf & 0x7fffffff8);
  }
  this_00->capacity_proxy_ = iVar9 + -1;
  pvVar4 = this_00->tagged_rep_or_elem_;
  if (((ulong)pvVar4 & 1) == 0) {
    *__dest = (uint)(pvVar4 != (void *)0x0);
    *(void **)(__dest + 2) = pvVar4;
  }
  else {
    __src = internal::RepeatedPtrFieldBase::rep(this_00);
    memcpy(__dest,__src,(long)__src->allocated_size * 8 + 8);
    uVar10 = unaff_RBP * 8 + 8;
    if (unaff_R14 == (Arena *)0x0) {
      operator_delete(__src,uVar10);
    }
    else {
      lVar5 = __tls_get_addr(&PTR_001b3f20);
      if (*(long *)(lVar5 + 8) == *(long *)unaff_R14) {
        internal::SerialArena::ReturnArrayMemory(*(SerialArena **)(lVar5 + 0x10),__src,uVar10);
      }
    }
  }
  this_00->tagged_rep_or_elem_ = (void *)((long)__dest + 1);
  return (Cord *)(__dest + (long)this_00->current_size_ * 2 + 2);
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }